

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_vmevent.c
# Opt level: O0

void lj_vmevent_call(lua_State *L,ptrdiff_t argbase)

{
  undefined1 uVar1;
  byte bVar2;
  uint64_t uVar3;
  int iVar4;
  char *local_30;
  int status;
  uint8_t oldh;
  uint8_t oldmask;
  global_State *g;
  ptrdiff_t argbase_local;
  lua_State *L_local;
  
  uVar3 = (L->glref).ptr64;
  uVar1 = *(undefined1 *)(uVar3 + 0x93);
  bVar2 = *(byte *)(uVar3 + 0x91);
  *(undefined1 *)(uVar3 + 0x93) = 0;
  *(byte *)(uVar3 + 0x91) = *(byte *)(uVar3 + 0x91) | 0x30;
  iVar4 = lj_vm_pcall(L,(L->stack).ptr64 + argbase,1,0);
  if (iVar4 != 0) {
    L->top = L->top + -1;
    fputs("VM handler failed: ",_stderr);
    if ((int)(L->top->field_4).it >> 0xf == -5) {
      local_30 = (char *)((L->top->u64 & 0x7fffffffffff) + 0x18);
    }
    else {
      local_30 = "?";
    }
    fputs(local_30,_stderr);
    fputc(10,_stderr);
  }
  *(byte *)(uVar3 + 0x91) = *(byte *)(uVar3 + 0x91) & 0xf | bVar2 & 0xf0;
  if (*(char *)(uVar3 + 0x93) != -1) {
    *(undefined1 *)(uVar3 + 0x93) = uVar1;
  }
  return;
}

Assistant:

void lj_vmevent_call(lua_State *L, ptrdiff_t argbase)
{
  global_State *g = G(L);
  uint8_t oldmask = g->vmevmask;
  uint8_t oldh = hook_save(g);
  int status;
  g->vmevmask = 0;  /* Disable all events. */
  hook_vmevent(g);
  status = lj_vm_pcall(L, restorestack(L, argbase), 0+1, 0);
  if (LJ_UNLIKELY(status)) {
    /* Really shouldn't use stderr here, but where else to complain? */
    L->top--;
    fputs("VM handler failed: ", stderr);
    fputs(tvisstr(L->top) ? strVdata(L->top) : "?", stderr);
    fputc('\n', stderr);
  }
  hook_restore(g, oldh);
  if (g->vmevmask != VMEVENT_NOCACHE)
    g->vmevmask = oldmask;  /* Restore event mask, but not if not modified. */
}